

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O3

int ply_read_chunk_reverse(p_ply ply,void *anybuffer,size_t size)

{
  undefined1 uVar1;
  int iVar2;
  undefined1 *puVar3;
  ulong uVar4;
  char *data;
  
  iVar2 = ply_read_chunk(ply,anybuffer,size);
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 1;
    if (1 < size) {
      puVar3 = (undefined1 *)((size - 1) + (long)anybuffer);
      uVar4 = 0;
      do {
        uVar1 = *(undefined1 *)((long)anybuffer + uVar4);
        *(undefined1 *)((long)anybuffer + uVar4) = *puVar3;
        *puVar3 = uVar1;
        uVar4 = uVar4 + 1;
        puVar3 = puVar3 + -1;
      } while (size >> 1 != uVar4);
    }
  }
  return iVar2;
}

Assistant:

static int ply_read_chunk_reverse(p_ply ply, void *anybuffer, size_t size) {
    if (!ply_read_chunk(ply, anybuffer, size)) return 0;
    ply_reverse(anybuffer, size);
    return 1;
}